

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Reference __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::DoReadReference(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  int iVar1;
  int iVar2;
  Reference RVar3;
  int iVar4;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar5;
  undefined4 uVar6;
  Impl *local_28;
  
  iVar2 = ReadUInt(this,this->num_vars_and_exprs_);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  iVar1 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  iVar4 = iVar2 - iVar1;
  if (iVar2 < iVar1) {
    pBVar5 = this->handler_->builder_;
    local_28 = (Impl *)0x0;
    std::
    vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
    ::emplace_back<mp::internal::ExprBase::Impl_const*>
              ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                *)&(pBVar5->super_ExprFactory).exprs_,&local_28);
    uVar6 = 2;
    iVar4 = iVar2;
  }
  else {
    pBVar5 = this->handler_->builder_;
    local_28 = (Impl *)0x0;
    std::
    vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
    ::emplace_back<mp::internal::ExprBase::Impl_const*>
              ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                *)&(pBVar5->super_ExprFactory).exprs_,&local_28);
    uVar6 = 3;
  }
  RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)operator_new__(0x40);
  *(undefined4 *)RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       uVar6;
  ((BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> *)
  ((pBVar5->super_ExprFactory).exprs_.
   super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
   ._M_impl.super__Vector_impl_data._M_finish + -1))->super_ExprBase =
       (ExprBase)RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  *(int *)((long)RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ +
          4) = iVar4;
  return (Reference)RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }